

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

Benchmark * __thiscall benchmark::internal::Benchmark::Arg(Benchmark *this,int x)

{
  int iVar1;
  CheckHandler CStack_18;
  
  iVar1 = BenchmarkImp::ArgsCnt(this->imp_);
  if (iVar1 != -1) {
    iVar1 = BenchmarkImp::ArgsCnt(this->imp_);
    if (iVar1 != 1) {
      CheckHandler::CheckHandler
                (&CStack_18,"imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                 ,"Arg",0x2a2);
      CheckHandler::~CheckHandler(&CStack_18);
    }
  }
  GetNullLogInstance();
  BenchmarkImp::Arg(this->imp_,x);
  return this;
}

Assistant:

Benchmark* Benchmark::Arg(int x) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1);
  imp_->Arg(x);
  return this;
}